

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_fekete_rule.cpp
# Opt level: O0

int fekete_order_num(int rule)

{
  int suborder_num_00;
  int *piVar1;
  int suborder_num;
  int *suborder;
  int local_10;
  int order_num;
  int order;
  int rule_local;
  
  suborder_num_00 = fekete_suborder_num(rule);
  piVar1 = fekete_suborder(rule,suborder_num_00);
  suborder._4_4_ = 0;
  for (local_10 = 0; local_10 < suborder_num_00; local_10 = local_10 + 1) {
    suborder._4_4_ = suborder._4_4_ + piVar1[local_10];
  }
  if (piVar1 != (int *)0x0) {
    operator_delete__(piVar1);
  }
  return suborder._4_4_;
}

Assistant:

int fekete_order_num ( int rule )

//****************************************************************************80
//
//  Purpose:
//
//    FEKETE_ORDER_NUM returns the order of a Fekete rule for the triangle.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 October 2006
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Mark Taylor, Beth Wingate, Rachel Vincent,
//    An Algorithm for Computing Fekete Points in the Triangle,
//    SIAM Journal on Numerical Analysis,
//    Volume 38, Number 5, 2000, pages 1707-1720.
//
//  Parameters:
//
//    Input, int RULE, the index of the rule.
//
//    Output, int FEKETE_ORDER_NUM, the order (number of points) of the rule.
//
{
  int order;
  int order_num;
  int *suborder;
  int suborder_num;

  suborder_num = fekete_suborder_num ( rule );

  suborder = fekete_suborder ( rule, suborder_num );

  order_num = 0;
  for ( order = 0; order < suborder_num; order++ )
  {
    order_num = order_num + suborder[order];
  }

  delete [] suborder;

  return order_num;
}